

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BinaryOpCase::logSingleOperationCalculationInfo
          (BinaryOpCase *this)

{
  bool bVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  MessageBuilder local_1a8;
  char *local_28;
  char *opName;
  int opDiff;
  int numOpsInsideLoopInBigProgram;
  int numOpsInsideLoopInSmallProgram;
  int baseNumOpsInsideLoop;
  BinaryOpCase *this_local;
  
  numOpsInsideLoopInBigProgram = 8;
  opDiff = 0x10;
  opName._4_4_ = 0x20;
  opName._0_4_ = 0x10;
  _numOpsInsideLoopInSmallProgram = this;
  bVar1 = std::operator==(&this->m_op,"+");
  if (bVar1) {
    local_1c8 = "addition";
  }
  else {
    bVar1 = std::operator==(&this->m_op,"-");
    if (bVar1) {
      local_1d0 = "subtraction";
    }
    else {
      bVar1 = std::operator==(&this->m_op,"*");
      if (bVar1) {
        local_1d8 = "multiplication";
      }
      else {
        bVar1 = std::operator==(&this->m_op,"/");
        local_1d8 = (char *)0x0;
        if (bVar1) {
          local_1d8 = "division";
        }
      }
      local_1d0 = local_1d8;
    }
    local_1c8 = local_1d0;
  }
  local_28 = local_1c8;
  this_00 = tcu::TestContext::getLog
                      ((this->super_OperatorPerformanceCase).super_TestCase.super_TestNode.m_testCtx
                      );
  tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1a8,(char (*) [35])"Note: the bigger program contains ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&opName);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [7])" more ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_28);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [59])
                             " operations in one loop iteration than the small program; ");
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [95])
                             "cost of one operation is calculated as (cost_of_bigger_workload - cost_of_smaller_workload) / "
                     );
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&opName);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  return;
}

Assistant:

void BinaryOpCase::logSingleOperationCalculationInfo (void) const
{
	const int			baseNumOpsInsideLoop			= 2 * BINARY_OPERATOR_CASE_NUM_INDEPENDENT_CALCULATIONS;
	const int			numOpsInsideLoopInSmallProgram	= baseNumOpsInsideLoop * BINARY_OPERATOR_CASE_SMALL_PROGRAM_UNROLL_AMOUNT;
	const int			numOpsInsideLoopInBigProgram	= baseNumOpsInsideLoop * BINARY_OPERATOR_CASE_BIG_PROGRAM_UNROLL_AMOUNT;
	const int			opDiff							= numOpsInsideLoopInBigProgram - numOpsInsideLoopInSmallProgram;
	const char* const	opName							= m_op == "+" ? "addition"
														: m_op == "-" ? "subtraction"
														: m_op == "*" ? "multiplication"
														: m_op == "/" ? "division"
														: DE_NULL;
	DE_ASSERT(opName != DE_NULL);

	m_testCtx.getLog() << TestLog::Message << "Note: the bigger program contains " << opDiff << " more "
										   << opName << " operations in one loop iteration than the small program; "
										   << "cost of one operation is calculated as (cost_of_bigger_workload - cost_of_smaller_workload) / " << opDiff
										   << TestLog::EndMessage;
}